

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
::split(btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  bool bVar4;
  template_ElementType<1UL> *ptVar5;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar6;
  slot_type *psVar7;
  slot_type *psVar8;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *c;
  allocator_type *alloc_00;
  allocator_type *extraout_RDX;
  allocator_type *alloc_01;
  allocator_type *extraout_RDX_00;
  allocator_type *alloc_02;
  int iVar9;
  byte bVar10;
  allocator_type *in_R9;
  ulong uVar11;
  size_type i;
  ulong i_00;
  allocator_type local_40;
  allocator_type local_38;
  
  fVar1 = count(dest);
  if (fVar1 != '\0') {
    __assert_fail("dest->count() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8fb,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>]"
                 );
  }
  fVar1 = max_count(this);
  if (fVar1 == '\x1e') {
    if (insert_position == 0x1e) {
      bVar10 = 0;
    }
    else if (insert_position == 0) {
      fVar1 = count(this);
      bVar10 = fVar1 - 1;
    }
    else {
      bVar10 = count(this);
      bVar10 = bVar10 >> 1;
    }
    ptVar5 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                              *)dest);
    ptVar5[2] = bVar10;
    fVar1 = count(this);
    fVar2 = count(dest);
    ptVar5 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
             ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                              *)this);
    ptVar5[2] = fVar1 - fVar2;
    fVar1 = count(this);
    if (fVar1 != '\0') {
      bVar10 = count(dest);
      bVar3 = count(this);
      alloc_00 = (allocator_type *)0x0;
      uninitialized_move_n(this,(ulong)bVar10,(ulong)bVar3,0,dest,in_R9);
      bVar10 = count(this);
      bVar3 = count(dest);
      value_destroy_n(this,(ulong)bVar10,(ulong)bVar3,alloc_00);
      fVar1 = count(this);
      ptVar5 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
               ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                                *)this);
      ptVar5[2] = fVar1 + 0xff;
      pbVar6 = parent(this);
      bVar10 = position(this);
      bVar3 = count(this);
      local_40.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ =
           (CountingAllocator<std::pair<const_int,_int>_>)slot(this,(ulong)bVar3);
      bVar3 = count(pbVar6);
      if (bVar3 < bVar10) {
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>, Args = <phmap::priv::map_slot_type<int, int> *>]"
                     );
      }
      uVar11 = (ulong)bVar10;
      bVar3 = count(pbVar6);
      if (bVar10 < bVar3) {
        bVar10 = count(pbVar6);
        bVar3 = count(pbVar6);
        local_38.super_CountingAllocator<std::pair<const_int,_int>_>.bytes_used_ =
             (CountingAllocator<std::pair<const_int,_int>_>)slot(pbVar6,(ulong)bVar3 - 1);
        btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
        ::value_init<phmap::priv::map_slot_type<int,int>*>
                  ((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                    *)pbVar6,(ulong)bVar10,&local_38,(map_slot_type<int,_int> **)alloc_00);
        bVar10 = count(pbVar6);
        alloc_01 = extraout_RDX;
        for (i = (ulong)bVar10 - 2; uVar11 < i + 1; i = i - 1) {
          psVar7 = slot(pbVar6,i);
          psVar8 = slot(pbVar6,i + 1);
          (psVar8->value).first = (psVar7->value).first;
          alloc_00 = (allocator_type *)(ulong)(uint)(psVar7->value).second;
          (psVar8->value).second = (psVar7->value).second;
          alloc_01 = extraout_RDX_00;
        }
        value_destroy(pbVar6,uVar11,alloc_01);
      }
      btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
      ::value_init<phmap::priv::map_slot_type<int,int>*>
                ((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                  *)pbVar6,uVar11,&local_40,(map_slot_type<int,_int> **)alloc_00);
      fVar1 = count(pbVar6);
      ptVar5 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
               ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                                *)pbVar6);
      ptVar5[2] = fVar1 + '\x01';
      bVar4 = leaf(pbVar6);
      if (!bVar4) {
        bVar10 = count(pbVar6);
        uVar11 = uVar11 + 1;
        if (uVar11 < bVar10) {
          bVar10 = count(pbVar6);
          i_00 = (ulong)bVar10;
          while ((long)uVar11 < (long)i_00) {
            c = child(pbVar6,i_00 - 1);
            set_child(pbVar6,i_00,c);
            i_00 = i_00 - 1;
          }
          mutable_child(pbVar6,uVar11);
        }
      }
      bVar10 = count(this);
      value_destroy(this,(ulong)bVar10,alloc_02);
      pbVar6 = parent(this);
      bVar10 = position(this);
      init_child(pbVar6,bVar10 + 1,dest);
      bVar4 = leaf(this);
      if (!bVar4) {
        iVar9 = 1;
        while( true ) {
          bVar10 = count(dest);
          if ((uint)bVar10 < iVar9 - 1U) break;
          bVar10 = count(this);
          pbVar6 = child(this,(ulong)((uint)bVar10 + iVar9));
          if (pbVar6 == (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                         *)0x0) {
            __assert_fail("child(count() + i + 1) != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x91a,
                          "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>]"
                         );
          }
          bVar10 = count(this);
          pbVar6 = child(this,(ulong)((uint)bVar10 + iVar9));
          init_child(dest,iVar9 - 1U,pbVar6);
          bVar10 = count(this);
          mutable_child(this,(ulong)((uint)bVar10 + iVar9));
          iVar9 = iVar9 + 1;
        }
      }
      return;
    }
    __assert_fail("count() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x90a,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>]"
                 );
  }
  __assert_fail("max_count() == kNodeValues",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x8fc,
                "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }